

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database.c
# Opt level: O0

void CGTFS_Database(void)

{
  int iVar1;
  greatest_test_res local_28;
  greatest_test_res local_24;
  greatest_test_res res_7;
  greatest_test_res res_6;
  greatest_test_res res_5;
  greatest_test_res res_4;
  greatest_test_res res_3;
  greatest_test_res res_2;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("db_init_close_writable");
  if (iVar1 == 1) {
    res_2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_2 == GREATEST_TEST_RES_PASS) {
      res_2 = db_init_close_writable();
    }
    greatest_test_post(res_2);
  }
  iVar1 = greatest_test_pre("db_init_close_readable_error");
  if (iVar1 == 1) {
    res_3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_3 == GREATEST_TEST_RES_PASS) {
      res_3 = db_init_close_readable_error();
    }
    greatest_test_post(res_3);
  }
  iVar1 = greatest_test_pre("db_init_close_readable_success");
  if (iVar1 == 1) {
    res_4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_4 == GREATEST_TEST_RES_PASS) {
      res_4 = db_init_close_readable_success();
    }
    greatest_test_post(res_4);
  }
  iVar1 = greatest_test_pre("db_import");
  if (iVar1 == 1) {
    res_5 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_5 == GREATEST_TEST_RES_PASS) {
      res_5 = db_import();
    }
    greatest_test_post(res_5);
  }
  iVar1 = greatest_test_pre("db_store_no_counter");
  if (iVar1 == 1) {
    res_6 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_6 == GREATEST_TEST_RES_PASS) {
      res_6 = db_store_no_counter();
    }
    greatest_test_post(res_6);
  }
  iVar1 = greatest_test_pre("db_store_partial");
  if (iVar1 == 1) {
    res_7 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_7 == GREATEST_TEST_RES_PASS) {
      res_7 = db_store_partial();
    }
    greatest_test_post(res_7);
  }
  iVar1 = greatest_test_pre("db_store_counter");
  if (iVar1 == 1) {
    local_24 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_24 == GREATEST_TEST_RES_PASS) {
      local_24 = db_store_counter();
    }
    greatest_test_post(local_24);
  }
  iVar1 = greatest_test_pre("db_fetch");
  if (iVar1 == 1) {
    local_28 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_28 == GREATEST_TEST_RES_PASS) {
      local_28 = db_fetch();
    }
    greatest_test_post(local_28);
  }
  return;
}

Assistant:

SUITE(CGTFS_Database) {
    RUN_TEST(db_init_close_writable);
    RUN_TEST(db_init_close_readable_error);
    RUN_TEST(db_init_close_readable_success);
    RUN_TEST(db_import);
    RUN_TEST(db_store_no_counter);
    RUN_TEST(db_store_partial);
    RUN_TEST(db_store_counter); // These two tests must come together AND in this order
    RUN_TEST(db_fetch);         // as db_fetch() uses the db file created by db_store_counter.
}